

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O1

void Aig_MmStepStop(Aig_MmStep_t *p,int fVerbose)

{
  long lVar1;
  
  if (0 < p->nMems) {
    lVar1 = 0;
    do {
      Aig_MmFixedStop(p->pMems[lVar1],fVerbose);
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nMems);
  }
  if (p->nChunksAlloc != 0) {
    if (0 < p->nChunks) {
      lVar1 = 0;
      do {
        if (p->pChunks[lVar1] != (char *)0x0) {
          free(p->pChunks[lVar1]);
          p->pChunks[lVar1] = (char *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nChunks);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
      p->pChunks = (char **)0x0;
    }
  }
  if (p->pMems != (Aig_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Aig_MmFixed_t **)0x0;
  }
  if (p->pMap != (Aig_MmFixed_t **)0x0) {
    free(p->pMap);
    p->pMap = (Aig_MmFixed_t **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Aig_MmStepStop( Aig_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Aig_MmFixedStop( p->pMems[i], fVerbose );
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        ABC_FREE( p->pChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}